

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_to_bytes(wally_tx *tx,uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  int iVar1;
  size_t is_elements;
  
  is_elements = 0;
  iVar1 = wally_tx_is_elements(tx,&is_elements);
  if (iVar1 == 0) {
    iVar1 = tx_to_bytes(tx,(tx_serialize_opts *)0x0,flags,bytes_out,len,written,is_elements != 0);
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int wally_tx_to_bytes(const struct wally_tx *tx, uint32_t flags,
                      unsigned char *bytes_out, size_t len,
                      size_t *written)
{
    size_t is_elements = 0;

#ifdef BUILD_ELEMENTS
    if (wally_tx_is_elements(tx, &is_elements) != WALLY_OK)
        return WALLY_EINVAL;
#endif
    return tx_to_bytes(tx, NULL, flags, bytes_out, len, written, is_elements);
}